

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

QColor QtMWidgets::lighterColor(QColor *c,int b)

{
  undefined8 uVar1;
  QColor QVar2;
  undefined1 auVar3 [16];
  undefined4 local_60;
  undefined2 uStack_5c;
  Spec local_50;
  ushort uStack_4c;
  undefined8 local_44;
  QColor hsv;
  int a;
  int v;
  int s;
  int h;
  int b_local;
  QColor *c_local;
  undefined4 local_10;
  undefined2 uStack_c;
  undefined2 uStack_a;
  
  if (b < 1) {
    c_local = *(QColor **)c;
    uVar1 = *(undefined8 *)((long)&c->ct + 4);
    local_10 = (undefined4)uVar1;
    uStack_c = (undefined2)((ulong)uVar1 >> 0x20);
    uStack_a = (undefined2)((ulong)uVar1 >> 0x30);
  }
  else {
    v = 0;
    a = 0;
    hsv._12_4_ = 0;
    hsv.ct._4_4_ = 0;
    s = b;
    _h = c;
    auVar3 = QColor::toHsv();
    local_44 = auVar3._0_8_;
    local_50 = auVar3._8_4_;
    hsv.cspec = local_50;
    uStack_4c = auVar3._12_2_;
    hsv.ct.argb.alpha = uStack_4c;
    QColor::getHsv((int *)&local_44,&v,&a,(int *)&hsv.ct.argb.pad);
    hsv._12_4_ = s + hsv._12_4_;
    if (0xff < (int)hsv._12_4_) {
      a = a - (hsv._12_4_ + -0xff);
      if (a < 0) {
        a = 0;
      }
      hsv._12_4_ = 0xff;
    }
    QColor::setHsv((Spec)&local_44,v,a,hsv._12_4_);
    QColor::spec(_h);
    auVar3 = QColor::convertTo((Spec)&local_44);
    c_local = auVar3._0_8_;
    local_60 = auVar3._8_4_;
    local_10 = local_60;
    uStack_5c = auVar3._12_2_;
    uStack_c = uStack_5c;
  }
  QVar2.ct._4_4_ = local_10;
  QVar2._0_8_ = c_local;
  QVar2.ct.argb.pad = uStack_c;
  QVar2._14_2_ = uStack_a;
  return QVar2;
}

Assistant:

QColor
lighterColor( const QColor & c, int b )
{
	if( b <= 0 )
		return c;

	int h = 0;
	int s = 0;
	int v = 0;
	int a = 0;

	QColor hsv = c.toHsv();
	hsv.getHsv( &h, &s, &v, &a );

	v += b;

	if( v > 255 )
	{
		s -= v - 255;

		if( s < 0 ) s = 0;

		v = 255;
	}

	hsv.setHsv( h, s, v, a );

	return hsv.convertTo( c.spec() );
}